

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.h
# Opt level: O0

void __thiscall Assimp::ASE::Material::Material(Material *this,Material *other)

{
  Material *other_local;
  Material *this_local;
  
  D3DS::Material::Material(&this->super_Material,&other->super_Material);
  (this->super_Material)._vptr_Material = (_func_int **)&PTR__Material_00edb250;
  std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::vector
            (&this->avSubMaterials,&other->avSubMaterials);
  this->pcInstance = other->pcInstance;
  this->bNeed = (bool)(other->bNeed & 1);
  other->pcInstance = (aiMaterial *)0x0;
  return;
}

Assistant:

Material(Material &&other) AI_NO_EXCEPT
    : D3DS::Material(std::move(other))
    , avSubMaterials(std::move(other.avSubMaterials))
    , pcInstance(std::move(other.pcInstance))
    , bNeed(std::move(other.bNeed))
    {
        other.pcInstance = nullptr;
    }